

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomTime::write(DomTime *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  undefined4 in_register_00000034;
  QString *pQVar2;
  long in_FS_OFFSET;
  char16_t *str;
  DataPointer *in_stack_fffffffffffffe68;
  QArrayDataPointer<char16_t> *in_stack_fffffffffffffe70;
  QString *pQVar3;
  QString *in_stack_fffffffffffffe78;
  QString *str_00;
  undefined1 local_138 [64];
  QAnyStringView *local_f8;
  undefined1 local_e8 [64];
  QAnyStringView *local_a8;
  undefined1 local_98 [64];
  QAnyStringView *local_58;
  QArrayDataPointer<char16_t> local_48 [2];
  long local_8;
  
  pQVar2 = (QString *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  str_00 = pQVar2;
  bVar1 = QString::isEmpty((QString *)0x1bbfa9);
  if (bVar1) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_48,(Data *)0x0,L"time",4);
    QString::QString((QString *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  }
  else {
    QString::toLower((QString *)in_stack_fffffffffffffe68);
  }
  QAnyStringView::QAnyStringView((QAnyStringView *)this,in_stack_fffffffffffffe78);
  QXmlStreamWriter::writeStartElement((QAnyStringView *)str_00);
  QString::~QString((QString *)0x1bc05c);
  if (bVar1) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffe70);
  }
  if ((this->m_children & 1) != 0) {
    in_stack_fffffffffffffe78 = pQVar2;
    Qt::Literals::StringLiterals::operator____s((char16_t *)str_00,(size_t)this);
    QAnyStringView::QAnyStringView((QAnyStringView *)this,in_stack_fffffffffffffe78);
    QString::number((int)local_98,this->m_hour);
    QAnyStringView::QAnyStringView((QAnyStringView *)this,in_stack_fffffffffffffe78);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)in_stack_fffffffffffffe78,local_58);
    QString::~QString((QString *)0x1bc123);
    QString::~QString((QString *)0x1bc130);
  }
  if ((this->m_children & 2) != 0) {
    pQVar3 = pQVar2;
    Qt::Literals::StringLiterals::operator____s((char16_t *)str_00,(size_t)this);
    QAnyStringView::QAnyStringView((QAnyStringView *)this,in_stack_fffffffffffffe78);
    QString::number((int)local_e8,this->m_minute);
    QAnyStringView::QAnyStringView((QAnyStringView *)this,in_stack_fffffffffffffe78);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)pQVar3,local_a8);
    QString::~QString((QString *)0x1bc1e1);
    QString::~QString((QString *)0x1bc1ee);
  }
  if ((this->m_children & 4) != 0) {
    Qt::Literals::StringLiterals::operator____s((char16_t *)str_00,(size_t)this);
    QAnyStringView::QAnyStringView((QAnyStringView *)this,in_stack_fffffffffffffe78);
    QString::number((int)local_138,this->m_second);
    QAnyStringView::QAnyStringView((QAnyStringView *)this,in_stack_fffffffffffffe78);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)pQVar2,local_f8);
    QString::~QString((QString *)0x1bc28e);
    QString::~QString((QString *)0x1bc29b);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomTime::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("time") : tagName.toLower());

    if (m_children & Hour)
        writer.writeTextElement(u"hour"_s, QString::number(m_hour));

    if (m_children & Minute)
        writer.writeTextElement(u"minute"_s, QString::number(m_minute));

    if (m_children & Second)
        writer.writeTextElement(u"second"_s, QString::number(m_second));

    writer.writeEndElement();
}